

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

void __thiscall
FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
          (FOptionMenuItemOptionBase *this,char *label,char *menu,char *values,char *graycheck,
          int center)

{
  int iVar1;
  FBaseCVar *pFVar2;
  FName local_34;
  
  FName::NameManager::FindName(&FName::NameData,menu,false);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_34,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItem_006f1090;
  *(undefined4 *)&(this->super_FOptionMenuItem).field_0x24 = 0;
  iVar1 = FName::NameManager::FindName(&FName::NameData,values,false);
  *(int *)&(this->super_FOptionMenuItem).field_0x24 = iVar1;
  pFVar2 = FindCVar(graycheck,(FBaseCVar **)0x0);
  this->mGrayCheck = pFVar2;
  this->mCenter = center;
  return;
}

Assistant:

FOptionMenuItemOptionBase(const char *label, const char *menu, const char *values, const char *graycheck, int center)
		: FOptionMenuItem(label, menu)
	{
		mValues = values;
		mGrayCheck = (FBoolCVar*)FindCVar(graycheck, NULL);
		mCenter = center;
	}